

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int,_int)>::UntypedPerformAction
          (FunctionMocker<int_(int,_int,_int,_int,_int)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<int> *pAVar1;
  ArgumentTuple *args;
  Action<int_(int,_int,_int,_int,_int)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<int_(int,_int,_int,_int,_int)> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<int_(int,_int,_int,_int,_int)>::Action
            ((Action<int_(int,_int,_int,_int,_int)> *)&args,
             (Action<int_(int,_int,_int,_int,_int)> *)untyped_action);
  pAVar1 = ActionResultHolder<int>::PerformAction<int(int,int,int,int,int)>
                     ((Action<int_(int,_int,_int,_int,_int)> *)&args,
                      (ArgumentTuple *)action.fun_._M_invoker);
  Action<int_(int,_int,_int,_int,_int)>::~Action((Action<int_(int,_int,_int,_int,_int)> *)&args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }